

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t HUF_writeCTable_wksp
                 (void *dst,size_t maxDstSize,HUF_CElt *CTable,uint maxSymbolValue,uint huffLog,
                 void *workspace,size_t workspaceSize)

{
  void *workspace_00;
  void *pvVar1;
  uint in_ECX;
  size_t in_RDX;
  void *in_RSI;
  size_t *in_RDI;
  int in_R8D;
  size_t unaff_retaddr;
  void *in_stack_00000008;
  size_t hSize;
  HUF_WriteCTableWksp *wksp;
  U32 n;
  BYTE *op;
  HUF_CElt *ct;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  uint uVar2;
  size_t *wtSize;
  void *in_stack_fffffffffffffff8;
  size_t sVar3;
  
  workspace_00 = (void *)(in_RDX + 8);
  wtSize = in_RDI;
  pvVar1 = HUF_alignUpWorkspace
                     (workspace_00,in_RDI,
                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (in_stack_00000008 < (void *)0x2ec) {
    sVar3 = 0xffffffffffffffff;
  }
  else if (in_ECX < 0x100) {
    *(undefined1 *)((long)pvVar1 + 0x1e0) = 0;
    for (uVar2 = 1; uVar2 < in_R8D + 1U; uVar2 = uVar2 + 1) {
      *(char *)((long)pvVar1 + (ulong)uVar2 + 0x1e0) = ((char)in_R8D + '\x01') - (char)uVar2;
    }
    for (uVar2 = 0; uVar2 < in_ECX; uVar2 = uVar2 + 1) {
      sVar3 = HUF_getNbBits(*(HUF_CElt *)((long)workspace_00 + (ulong)uVar2 * 8));
      *(undefined1 *)((long)pvVar1 + (ulong)uVar2 + 0x1ed) =
           *(undefined1 *)((long)pvVar1 + sVar3 + 0x1e0);
    }
    if (in_RSI == (void *)0x0) {
      sVar3 = 0xffffffffffffffba;
    }
    else {
      sVar3 = HUF_compressWeights(in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8,
                                  (size_t)wtSize,in_RSI,in_RDX);
      uVar2 = ERR_isError(sVar3);
      if (uVar2 == 0) {
        if (sVar3 < 2 || in_ECX >> 1 <= sVar3) {
          if (in_ECX < 0x81) {
            if (in_RSI < (void *)(ulong)((in_ECX + 1 >> 1) + 1)) {
              sVar3 = 0xffffffffffffffba;
            }
            else {
              *(char *)in_RDI = (char)in_ECX + '\x7f';
              *(undefined1 *)((long)pvVar1 + (ulong)in_ECX + 0x1ed) = 0;
              for (uVar2 = 0; uVar2 < in_ECX; uVar2 = uVar2 + 2) {
                *(char *)((long)in_RDI + (ulong)((uVar2 >> 1) + 1)) =
                     *(char *)((long)pvVar1 + (ulong)uVar2 + 0x1ed) * '\x10' +
                     *(char *)((long)pvVar1 + (ulong)(uVar2 + 1) + 0x1ed);
              }
              sVar3 = (size_t)((in_ECX + 1 >> 1) + 1);
            }
          }
          else {
            sVar3 = 0xffffffffffffffff;
          }
        }
        else {
          *(char *)in_RDI = (char)sVar3;
          sVar3 = sVar3 + 1;
        }
      }
    }
  }
  else {
    sVar3 = 0xffffffffffffffd2;
  }
  return sVar3;
}

Assistant:

size_t HUF_writeCTable_wksp(void* dst, size_t maxDstSize,
                            const HUF_CElt* CTable, unsigned maxSymbolValue, unsigned huffLog,
                            void* workspace, size_t workspaceSize)
{
    HUF_CElt const* const ct = CTable + 1;
    BYTE* op = (BYTE*)dst;
    U32 n;
    HUF_WriteCTableWksp* wksp = (HUF_WriteCTableWksp*)HUF_alignUpWorkspace(workspace, &workspaceSize, ZSTD_ALIGNOF(U32));

    HUF_STATIC_ASSERT(HUF_CTABLE_WORKSPACE_SIZE >= sizeof(HUF_WriteCTableWksp));

    /* check conditions */
    if (workspaceSize < sizeof(HUF_WriteCTableWksp)) return ERROR(GENERIC);
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);

    /* convert to weight */
    wksp->bitsToWeight[0] = 0;
    for (n=1; n<huffLog+1; n++)
        wksp->bitsToWeight[n] = (BYTE)(huffLog + 1 - n);
    for (n=0; n<maxSymbolValue; n++)
        wksp->huffWeight[n] = wksp->bitsToWeight[HUF_getNbBits(ct[n])];

    /* attempt weights compression by FSE */
    if (maxDstSize < 1) return ERROR(dstSize_tooSmall);
    {   CHECK_V_F(hSize, HUF_compressWeights(op+1, maxDstSize-1, wksp->huffWeight, maxSymbolValue, &wksp->wksp, sizeof(wksp->wksp)) );
        if ((hSize>1) & (hSize < maxSymbolValue/2)) {   /* FSE compressed */
            op[0] = (BYTE)hSize;
            return hSize+1;
    }   }

    /* write raw values as 4-bits (max : 15) */
    if (maxSymbolValue > (256-128)) return ERROR(GENERIC);   /* should not happen : likely means source cannot be compressed */
    if (((maxSymbolValue+1)/2) + 1 > maxDstSize) return ERROR(dstSize_tooSmall);   /* not enough space within dst buffer */
    op[0] = (BYTE)(128 /*special case*/ + (maxSymbolValue-1));
    wksp->huffWeight[maxSymbolValue] = 0;   /* to be sure it doesn't cause msan issue in final combination */
    for (n=0; n<maxSymbolValue; n+=2)
        op[(n/2)+1] = (BYTE)((wksp->huffWeight[n] << 4) + wksp->huffWeight[n+1]);
    return ((maxSymbolValue+1)/2) + 1;
}